

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  size_t capacity;
  slot_type *psVar1;
  undefined1 auVar2 [16];
  unsigned_long uVar3;
  slot_type *psVar4;
  size_t sVar5;
  FindInfo FVar6;
  Layout LVar7;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    psVar4 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar5 = 0;
      do {
        if (-1 < p[sVar5]) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (psVar4->value).first;
          hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                    SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
          FVar6 = find_first_non_full(this,hashval);
          set_ctrl(this,FVar6.offset,(byte)hashval & 0x7f);
          psVar1 = this->slots_;
          uVar3 = (psVar4->value).second;
          psVar1[FVar6.offset].value.first = (psVar4->value).first;
          psVar1[FVar6.offset].value.second = uVar3;
        }
        sVar5 = sVar5 + 1;
        psVar4 = psVar4 + 1;
      } while (capacity != sVar5);
      LVar7 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                ((allocator<std::pair<const_unsigned_long,_unsigned_long>_> *)&this->settings_,p,
                 LVar7.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<unsigned_long,_unsigned_long>_>
                 .size_[1] * 0x10 +
                 (LVar7.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<unsigned_long,_unsigned_long>_>
                  .size_[0] + 7 & 0xfffffffffffffff8));
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8dd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n)
		{
			return ((n + 1) & n) == 0 && n > 0;
		}